

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

ModuleData * FindModuleWithSourceLocation(ExpressionContext *ctx,char *position)

{
  bool bVar1;
  ModuleData **ppMVar2;
  uint i;
  uint index;
  
  index = 0;
  while( true ) {
    if ((ctx->imports).count <= index) {
      return (ModuleData *)0x0;
    }
    ppMVar2 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->imports,index);
    bVar1 = HasSourceCode((*ppMVar2)->bytecode,position);
    if (bVar1) break;
    index = index + 1;
  }
  ppMVar2 = SmallArray<ModuleData_*,_128U>::operator[](&ctx->imports,index);
  return *ppMVar2;
}

Assistant:

ModuleData* FindModuleWithSourceLocation(ExpressionContext &ctx, const char *position)
{
	for(unsigned i = 0; i < ctx.imports.size(); i++)
	{
		if(HasSourceCode(ctx.imports[i]->bytecode, position))
			return ctx.imports[i];
	}

	return NULL;
}